

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Array<kj::_::HashBucket> * __thiscall
kj::_::rehash(Array<kj::_::HashBucket> *__return_storage_ptr__,_ *this,
             ArrayPtr<const_kj::_::HashBucket> oldBuckets,size_t targetSize)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  HashBucket *pHVar4;
  ulong uVar5;
  HashBucket *size;
  uint uVar6;
  HashBucket *__begin2;
  uint collisionCount;
  uint entryCount;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  size_t targetSize_local;
  
  targetSize_local = oldBuckets.size_;
  pHVar4 = oldBuckets.ptr;
  _kjCondition.left = &targetSize_local;
  _kjCondition.right = 0x40000000;
  _kjCondition.op.content.ptr = anon_var_dwarf_b832;
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = targetSize_local < 0x40000000;
  if (!_kjCondition.result) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[36]>
              ((Fault *)&entryCount,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x47,FAILED,"targetSize < (1 << 30)",
               "_kjCondition,\"hash table has reached maximum size\"",&_kjCondition,
               (char (*) [36])"hash table has reached maximum size");
    Debug::Fault::fatal((Fault *)&entryCount);
  }
  iVar1 = 0x1f;
  if ((uint)oldBuckets.size_ != 0) {
    for (; (uint)oldBuckets.size_ >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  size = (HashBucket *)(ulong)(uint)(2 << ((byte)iVar1 & 0x1f));
  if (targetSize_local == 0) {
    size = (HashBucket *)0x0;
  }
  if (size <= pHVar4) {
    size = pHVar4;
  }
  heapArray<kj::_::HashBucket>(__return_storage_ptr__,(size_t)size);
  uVar6 = 0;
  memset(__return_storage_ptr__->ptr,0,(long)size << 3);
  entryCount = 0;
  collisionCount = 0;
  pHVar4 = (HashBucket *)(this + (long)pHVar4 * 8);
  uVar3 = 0;
  for (; (HashBucket *)this != pHVar4; this = (_ *)((long)this + 8)) {
    if (1 < ((HashBucket *)this)->value) {
      uVar3 = uVar3 + 1;
      uVar5 = (ulong)((HashBucket *)this)->hash % __return_storage_ptr__->size_;
      while (uVar2 = uVar5 & 0xffffffff, __return_storage_ptr__->ptr[uVar2].value != 0) {
        uVar6 = uVar6 + 1;
        uVar5 = 0;
        collisionCount = uVar6;
        if (uVar2 + 1 != __return_storage_ptr__->size_) {
          uVar5 = uVar2 + 1;
        }
      }
      __return_storage_ptr__->ptr[uVar2] = *(HashBucket *)this;
      entryCount = uVar3;
    }
  }
  if ((uVar3 * 4 + 0x10 < uVar6) &&
     (rehash(kj::ArrayPtr<kj::_::HashBucket_const>,unsigned_long)::warned == '\0')) {
    if (Debug::minSeverity < 2) {
      getStackTrace();
      Debug::log<char_const(&)[71],unsigned_int&,unsigned_int&,kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x67,WARNING,
                 "\"detected excessive collisions in hash table; is your hash function OK?\", entryCount, collisionCount, kj::getStackTrace()"
                 ,(char (*) [71])
                  "detected excessive collisions in hash table; is your hash function OK?",
                 &entryCount,&collisionCount,(String *)&_kjCondition);
      Array<char>::~Array((Array<char> *)&_kjCondition);
    }
    rehash(kj::ArrayPtr<kj::_::HashBucket_const>,unsigned_long)::warned = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<HashBucket> rehash(kj::ArrayPtr<const HashBucket> oldBuckets, size_t targetSize) {
  // Rehash the whole table.

  KJ_REQUIRE(targetSize < (1 << 30), "hash table has reached maximum size");

  size_t size = chooseHashTableSize(targetSize);

  if (size < oldBuckets.size()) {
    size = oldBuckets.size();
  }

  auto newBuckets = kj::heapArray<HashBucket>(size);
  memset(newBuckets.begin(), 0, sizeof(HashBucket) * size);

  uint entryCount = 0;
  uint collisionCount = 0;

  for (auto& oldBucket: oldBuckets) {
    if (oldBucket.isOccupied()) {
      ++entryCount;
      for (uint i = oldBucket.hash % newBuckets.size();; i = probeHash(newBuckets, i)) {
        auto& newBucket = newBuckets[i];
        if (newBucket.isEmpty()) {
          newBucket = oldBucket;
          break;
        }
        ++collisionCount;
      }
    }
  }

  if (collisionCount > 16 + entryCount * 4) {
    static bool warned = false;
    if (!warned) {
      KJ_LOG(WARNING, "detected excessive collisions in hash table; is your hash function OK?",
          entryCount, collisionCount, kj::getStackTrace());
      warned = true;
    }
  }

  return newBuckets;
}